

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

void __thiscall indigox::Molecule::Molecule(Molecule *this)

{
  unique_ptr<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_> *this_00;
  CountableObject<indigox::Molecule> *in_RDI;
  MolecularGraph *in_stack_ffffffffffffff78;
  pointer __p;
  MolecularGraph *in_stack_ffffffffffffff80;
  ElectronOpt *this_01;
  allocator local_9 [9];
  
  utils::CountableObject<indigox::Molecule>::CountableObject(in_RDI);
  std::enable_shared_from_this<indigox::Molecule>::enable_shared_from_this
            ((enable_shared_from_this<indigox::Molecule> *)0x10f10f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 3),"None",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  *(undefined4 *)&in_RDI[7].id_ = 0;
  std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>::
  vector((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_> *
         )0x10f168);
  std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>::
  vector((vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_> *
         )0x10f17b);
  std::
  unordered_map<unsigned_long,_std::weak_ptr<indigox::Atom>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::weak_ptr<indigox::Atom>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>_>
                   *)0x10f18e);
  this_01 = (ElectronOpt *)(in_RDI + 0x15);
  std::
  unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
  ::unordered_map((unordered_map<unsigned_long,_std::weak_ptr<indigox::Bond>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>_>
                   *)0x10f1a4);
  std::
  map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
  ::map((map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
         *)0x10f1ba);
  std::
  map<std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
  ::map((map<std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
         *)0x10f1d0);
  operator_new(0xc0);
  MolecularGraph::MolecularGraph(in_stack_ffffffffffffff80);
  std::shared_ptr<indigox::MolecularGraph>::shared_ptr<indigox::MolecularGraph,void>
            ((shared_ptr<indigox::MolecularGraph> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  __p = (pointer)(in_RDI + 0x2a);
  this_00 = (unique_ptr<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_> *)
            operator_new(0x90);
  ElectronOpt::ElectronOpt(this_01);
  std::unique_ptr<indigox::ElectronOpt,std::default_delete<indigox::ElectronOpt>>::
  unique_ptr<std::default_delete<indigox::ElectronOpt>,void>(this_00,__p);
  *(undefined1 *)&in_RDI[0x2b].id_ = 1;
  return;
}

Assistant:

Molecule::Molecule()
: name_("None"), graph_(new MolecularGraph()), elnopt_(new ElectronOpt()){ }